

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_win_get_attr_
               (MPIABI_Fint *win,MPIABI_Fint *win_keyval,void *attribute_val,int *flag,
               MPIABI_Fint *ierror)

{
  mpi_win_get_attr_();
  return;
}

Assistant:

void mpiabi_win_get_attr_(
  const MPIABI_Fint * win,
  const MPIABI_Fint * win_keyval,
  void * attribute_val,
  int * flag,
  MPIABI_Fint * ierror
) {
  return mpi_win_get_attr_(
    win,
    win_keyval,
    attribute_val,
    flag,
    ierror
  );
}